

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedDynamicMachine.hpp
# Opt level: O0

MediaTarget * __thiscall
Machine::TypedDynamicMachine<Enterprise::Machine>::get<MachineTypes::MediaTarget>
          (TypedDynamicMachine<Enterprise::Machine> *this)

{
  pointer pMVar1;
  MediaTarget *local_20;
  TypedDynamicMachine<Enterprise::Machine> *this_local;
  
  pMVar1 = std::unique_ptr<Enterprise::Machine,_std::default_delete<Enterprise::Machine>_>::get
                     (&this->machine_);
  if (pMVar1 == (pointer)0x0) {
    local_20 = (MediaTarget *)0x0;
  }
  else {
    local_20 = (MediaTarget *)
               __dynamic_cast(pMVar1,&Enterprise::Machine::typeinfo,
                              &MachineTypes::MediaTarget::typeinfo,0xfffffffffffffffe);
  }
  return local_20;
}

Assistant:

Class *get() {
			return dynamic_cast<Class *>(machine_.get());

			// Note to self: the below is not [currently] used
			// because in practice TypedDynamicMachine is instantiated
			// with an abstract parent of the actual class.
			//
			// TODO: rethink type hiding here. I think I've boxed myself
			// into an uncomfortable corner.
//			if constexpr (std::is_base_of_v<Class, T>) {
//				return static_cast<Class *>(machine_.get());
//			} else {
//				return nullptr;
//			}
		}